

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_from_binary_prefix
              (netaddr *dst,void *binary,size_t len,uint8_t addr_type,uint8_t prefix_len)

{
  ulong uVar1;
  uint8_t uVar2;
  int iVar3;
  undefined7 in_register_00000009;
  
  dst->_addr[0] = '\0';
  dst->_addr[1] = '\0';
  dst->_addr[2] = '\0';
  dst->_addr[3] = '\0';
  dst->_addr[4] = '\0';
  dst->_addr[5] = '\0';
  dst->_addr[6] = '\0';
  dst->_addr[7] = '\0';
  dst->_addr[8] = '\0';
  dst->_addr[9] = '\0';
  dst->_addr[10] = '\0';
  dst->_addr[0xb] = '\0';
  dst->_addr[0xc] = '\0';
  dst->_addr[0xd] = '\0';
  dst->_addr[0xe] = '\0';
  dst->_addr[0xf] = '\0';
  if ((int)CONCAT71(in_register_00000009,addr_type) == 0) {
    uVar1 = len - 4 >> 1;
    if ((uVar1 | (ulong)((len - 4 & 1) != 0) << 0x3f) < 7) {
      iVar3 = (*(code *)(&DAT_001587a0 + *(int *)(&DAT_001587a0 + uVar1 * 4)))();
      return iVar3;
    }
    dst->_type = '\0';
    if (0xf < len) {
      len = 0x10;
    }
  }
  else {
    dst->_type = addr_type;
  }
  uVar2 = (char)len * '\b';
  if (prefix_len != 0xff) {
    uVar2 = prefix_len;
  }
  dst->_prefix_len = uVar2;
  memcpy(dst,binary,len);
  return -(uint)(dst->_type == '\0');
}

Assistant:

int
netaddr_from_binary_prefix(struct netaddr *dst, const void *binary, size_t len, uint8_t addr_type, uint8_t prefix_len) {
  memset(dst->_addr, 0, sizeof(dst->_addr));

  if (addr_type != 0) {
    dst->_type = addr_type;
  }
  else {
    switch (len) {
      case 4:
        dst->_type = AF_INET;
        break;
      case 6:
        dst->_type = AF_MAC48;
        break;
      case 8:
        dst->_type = AF_EUI64;
        break;
      case 16:
        dst->_type = AF_INET6;
        break;
      default:
        dst->_type = AF_UNSPEC;
        if (len > 16) {
          len = 16;
        }
        break;
    }
  }

  if (prefix_len == 255) {
    prefix_len = len << 3;
  }

  dst->_prefix_len = prefix_len;
  memcpy(dst->_addr, binary, len);

  return dst->_type == AF_UNSPEC ? -1 : 0;
}